

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

ostream * std::operator<<(ostream *os,texcoord2f *v)

{
  ostream *poVar1;
  char *this;
  _anonymous_namespace_ *this_00;
  string local_58;
  string local_38;
  texcoord2f *local_18;
  texcoord2f *v_local;
  ostream *os_local;
  
  this = "(";
  local_18 = v;
  v_local = (texcoord2f *)os;
  poVar1 = std::operator<<(os,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)this,local_18->s);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  this_00 = (_anonymous_namespace_ *)0x5f1d6d;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_58,this_00,local_18->t);
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return (ostream *)v_local;
}

Assistant:

std::ostream &operator<<(std::ostream &os,
                         const tinyusdz::value::texcoord2f &v) {
  os << "(" << tinyusdz::dtos(v.s) << ", " << tinyusdz::dtos(v.t) << ")";
  return os;
}